

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_buf.c
# Opt level: O3

int nghttp2_bufs_init3(nghttp2_bufs *bufs,size_t chunk_length,size_t max_chunk,size_t chunk_keep,
                      size_t offset,nghttp2_mem *mem)

{
  uint8_t **ppuVar1;
  int iVar2;
  nghttp2_buf_chain *in_RAX;
  nghttp2_buf_chain *chain;
  nghttp2_buf_chain *local_38;
  
  iVar2 = -0x1f5;
  if (offset <= chunk_length && chunk_keep - 1 < max_chunk) {
    local_38 = in_RAX;
    iVar2 = buf_chain_new(&local_38,chunk_length,mem);
    if (iVar2 == 0) {
      bufs->mem = mem;
      bufs->offset = offset;
      bufs->head = local_38;
      bufs->cur = local_38;
      ppuVar1 = &(local_38->buf).pos;
      *ppuVar1 = *ppuVar1 + offset;
      ppuVar1 = &(local_38->buf).last;
      *ppuVar1 = *ppuVar1 + offset;
      bufs->chunk_length = chunk_length;
      bufs->chunk_used = 1;
      bufs->max_chunk = max_chunk;
      bufs->chunk_keep = chunk_keep;
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

int nghttp2_bufs_init3(nghttp2_bufs *bufs, size_t chunk_length,
                       size_t max_chunk, size_t chunk_keep, size_t offset,
                       nghttp2_mem *mem) {
  int rv;
  nghttp2_buf_chain *chain;

  if (chunk_keep == 0 || max_chunk < chunk_keep || chunk_length < offset) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  rv = buf_chain_new(&chain, chunk_length, mem);
  if (rv != 0) {
    return rv;
  }

  bufs->mem = mem;
  bufs->offset = offset;

  bufs->head = chain;
  bufs->cur = bufs->head;

  nghttp2_buf_shift_right(&bufs->cur->buf, offset);

  bufs->chunk_length = chunk_length;
  bufs->chunk_used = 1;
  bufs->max_chunk = max_chunk;
  bufs->chunk_keep = chunk_keep;

  return 0;
}